

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_unittest.cc
# Opt level: O1

void Test_Demangle_FromFile::RunTest(void)

{
  char cVar1;
  int iVar2;
  istream *piVar3;
  long lVar4;
  undefined8 extraout_RAX;
  string test_file;
  string line;
  string mangled;
  string demangled;
  ifstream f;
  long *local_2b8 [2];
  long local_2a8 [2];
  char *local_298;
  long local_290;
  char local_288;
  undefined7 uStack_287;
  long *local_278 [2];
  long local_268 [2];
  long *local_258 [2];
  long local_248 [2];
  long local_238 [4];
  byte abStack_218 [488];
  
  local_2b8[0] = local_2a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2b8,*fLS::FLAGS_test_srcdir_abi_cxx11_,
             fLS::FLAGS_test_srcdir_abi_cxx11_[1] + *fLS::FLAGS_test_srcdir_abi_cxx11_);
  std::__cxx11::string::append((char *)local_2b8);
  std::ifstream::ifstream((istream *)local_238,(char *)local_2b8[0],_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    local_298 = &local_288;
    local_290 = 0;
    local_288 = '\0';
    while( true ) {
      do {
        cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_298,cVar1);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
          if (local_298 != &local_288) {
            operator_delete(local_298,CONCAT71(uStack_287,local_288) + 1);
          }
          std::ifstream::~ifstream(local_238);
          if (local_2b8[0] != local_2a8) {
            operator_delete(local_2b8[0],local_2a8[0] + 1);
          }
          return;
        }
      } while ((local_290 == 0) || (*local_298 == '#'));
      lVar4 = std::__cxx11::string::find((char)(string *)&local_298,9);
      if (lVar4 == -1) break;
      std::__cxx11::string::substr((ulong)local_278,(ulong)&local_298);
      std::__cxx11::string::substr((ulong)local_258,(ulong)&local_298);
      google::Demangle((char *)local_278[0],DemangleIt(char_const*)::demangled,0x1000);
      iVar2 = std::__cxx11::string::compare((char *)local_258);
      if (iVar2 != 0) goto LAB_00111417;
      if (local_258[0] != local_248) {
        operator_delete(local_258[0],local_248[0] + 1);
      }
      if (local_278[0] != local_268) {
        operator_delete(local_278[0],local_268[0] + 1);
      }
    }
    RunTest();
LAB_00111417:
    RunTest();
  }
  RunTest();
  if (local_2b8[0] != local_2a8) {
    operator_delete(local_2b8[0],local_2a8[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(Demangle, FromFile) {
  string test_file = FLAGS_test_srcdir + "/src/demangle_unittest.txt";
  ifstream f(test_file.c_str());  // The file should exist.
  EXPECT_FALSE(f.fail());

  string line;
  while (getline(f, line)) {
    // Lines start with '#' are considered as comments.
    if (line.empty() || line[0] == '#') {
      continue;
    }
    // Each line should contain a mangled name and a demangled name
    // separated by '\t'.  Example: "_Z3foo\tfoo"
    string::size_type tab_pos = line.find('\t');
    EXPECT_NE(string::npos, tab_pos);
    string mangled = line.substr(0, tab_pos);
    string demangled = line.substr(tab_pos + 1);
    EXPECT_EQ(demangled, DemangleIt(mangled.c_str()));
  }
}